

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBody.cpp
# Opt level: O1

void __thiscall OpenMD::RigidBody::updateAtoms(RigidBody *this,int frame)

{
  double dVar1;
  Atom *pAVar2;
  double dVar3;
  double dVar4;
  bool bVar5;
  uint i;
  int iVar6;
  undefined4 extraout_var;
  long lVar7;
  undefined4 extraout_var_00;
  long *plVar8;
  double *pdVar9;
  undefined8 *puVar10;
  uint i_1;
  long lVar11;
  double *pdVar12;
  double (*padVar13) [3];
  double (*padVar14) [3];
  uint k;
  long lVar15;
  ulong uVar16;
  Vector3d apos;
  SquareMatrix3<double> result_1;
  Vector3d ref;
  SquareMatrix3<double> result;
  RotMat3x3d a;
  Vector3d local_158;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  double local_108 [4];
  double local_e8 [4];
  double local_c8 [10];
  double local_78 [9];
  
  local_108[0] = 0.0;
  local_108[1] = 0.0;
  uVar16 = 0;
  local_108[2] = 0.0;
  iVar6 = (*((this->super_StuntDouble).snapshotMan_)->_vptr_SnapshotManager[4])();
  lVar11 = (long)(this->super_StuntDouble).localIndex_;
  lVar7 = *(long *)(CONCAT44(extraout_var,iVar6) + (this->super_StuntDouble).storage_);
  pdVar9 = (double *)(lVar7 + lVar11 * 0x18);
  local_e8[0] = *pdVar9;
  local_e8[1] = pdVar9[1];
  local_e8[2] = *(double *)(lVar7 + 0x10 + lVar11 * 0x18);
  StuntDouble::getA((RotMat3x3d *)local_78,&this->super_StuntDouble,frame);
  if ((this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    do {
      StuntDouble::body2Lab
                (&local_158,&this->super_StuntDouble,
                 (this->refCoords_).
                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar16,frame);
      local_108[2] = local_158.super_Vector<double,_3U>.data_[2];
      local_108[0] = local_158.super_Vector<double,_3U>.data_[0];
      local_108[1] = local_158.super_Vector<double,_3U>.data_[1];
      local_158.super_Vector<double,_3U>.data_[0] = 0.0;
      local_158.super_Vector<double,_3U>.data_[1] = 0.0;
      local_158.super_Vector<double,_3U>.data_[2] = 0.0;
      lVar7 = 0;
      do {
        local_158.super_Vector<double,_3U>.data_[lVar7] = local_e8[lVar7] + local_108[lVar7];
        dVar4 = local_158.super_Vector<double,_3U>.data_[2];
        dVar3 = local_158.super_Vector<double,_3U>.data_[1];
        dVar1 = local_158.super_Vector<double,_3U>.data_[0];
        lVar7 = lVar7 + 1;
      } while (lVar7 != 3);
      pAVar2 = (this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar16];
      iVar6 = (*((pAVar2->super_StuntDouble).snapshotMan_)->_vptr_SnapshotManager[4])();
      lVar11 = (long)(pAVar2->super_StuntDouble).localIndex_;
      lVar7 = *(long *)(CONCAT44(extraout_var_00,iVar6) + (pAVar2->super_StuntDouble).storage_);
      pdVar9 = (double *)(lVar7 + lVar11 * 0x18);
      *pdVar9 = dVar1;
      pdVar9[1] = dVar3;
      *(double *)(lVar7 + 0x10 + lVar11 * 0x18) = dVar4;
      bVar5 = AtomType::isDirectional
                        ((this->atoms_).
                         super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl
                         .super__Vector_impl_data._M_start[uVar16]->atomType_);
      if (bVar5) {
        pAVar2 = (this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar16];
        if (pAVar2 == (Atom *)0x0) {
          plVar8 = (long *)0x0;
        }
        else {
          plVar8 = (long *)__dynamic_cast(pAVar2,&Atom::typeinfo,&DirectionalAtom::typeinfo);
        }
        padVar13 = (double (*) [3])
                   ((this->refOrients_).
                    super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar16);
        local_c8[6] = 0.0;
        local_c8[7] = 0.0;
        local_c8[4] = 0.0;
        local_c8[5] = 0.0;
        local_c8[2] = 0.0;
        local_c8[3] = 0.0;
        local_c8[0] = 0.0;
        local_c8[1] = 0.0;
        local_c8[8] = 0.0;
        pdVar9 = local_c8;
        lVar7 = 0;
        do {
          lVar11 = 0;
          pdVar12 = pdVar9;
          do {
            *pdVar12 = (((SquareMatrix<double,_3> *)*padVar13)->super_RectMatrix<double,_3U,_3U>).
                       data_[0][lVar11];
            lVar11 = lVar11 + 1;
            pdVar12 = pdVar12 + 3;
          } while (lVar11 != 3);
          lVar7 = lVar7 + 1;
          pdVar9 = pdVar9 + 1;
          padVar13 = padVar13 + 1;
        } while (lVar7 != 3);
        local_128 = 0;
        uStack_120 = 0;
        local_138 = 0;
        uStack_130 = 0;
        local_158.super_Vector<double,_3U>.data_[2] = 0.0;
        uStack_140 = 0;
        local_158.super_Vector<double,_3U>.data_[0] = 0.0;
        local_158.super_Vector<double,_3U>.data_[1] = 0.0;
        local_118 = 0;
        puVar10 = local_c8;
        lVar7 = 0;
        do {
          lVar11 = 0;
          padVar13 = (double (*) [3])local_78;
          do {
            pdVar9 = (&local_158)[lVar7].super_Vector<double,_3U>.data_ + lVar11;
            dVar1 = *pdVar9;
            lVar15 = 0;
            padVar14 = padVar13;
            do {
              dVar1 = dVar1 + (double)puVar10[lVar15] *
                              (((SquareMatrix<double,_3> *)*padVar14)->
                              super_RectMatrix<double,_3U,_3U>).data_[0][0];
              lVar15 = lVar15 + 1;
              padVar14 = padVar14 + 1;
            } while (lVar15 != 3);
            *pdVar9 = dVar1;
            lVar11 = lVar11 + 1;
            padVar13 = (double (*) [3])(*padVar13 + 1);
          } while (lVar11 != 3);
          lVar7 = lVar7 + 1;
          puVar10 = puVar10 + 3;
        } while (lVar7 != 3);
        (**(code **)(*plVar8 + 0x20))(plVar8,&local_158,frame);
      }
      uVar16 = (ulong)((int)uVar16 + 1);
    } while (uVar16 < (ulong)((long)(this->atoms_).
                                    super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->atoms_).
                                    super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return;
}

Assistant:

void RigidBody::updateAtoms(int frame) {
    unsigned int i;
    Vector3d ref;
    Vector3d apos;
    DirectionalAtom* dAtom;
    Vector3d pos = getPos(frame);
    RotMat3x3d a = getA(frame);

    for (i = 0; i < atoms_.size(); i++) {
      ref = body2Lab(refCoords_[i], frame);

      apos = pos + ref;

      atoms_[i]->setPos(apos, frame);

      if (atoms_[i]->isDirectional()) {
        dAtom = dynamic_cast<DirectionalAtom*>(atoms_[i]);
        dAtom->setA(refOrients_[i].transpose() * a, frame);
      }
    }
  }